

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

ngx_int_t ngx_strcasecmp(u_char *s1,u_char *s2)

{
  ulong local_40;
  ulong local_38;
  ngx_uint_t c2;
  ngx_uint_t c1;
  u_char *s2_local;
  u_char *s1_local;
  
  c1 = (ngx_uint_t)s2;
  s2_local = s1;
  while( true ) {
    local_38 = (ulong)*s2_local;
    local_40 = (ulong)*(byte *)c1;
    if ((0x40 < local_38) && (local_38 < 0x5b)) {
      local_38 = local_38 | 0x20;
    }
    if ((0x40 < local_40) && (local_40 < 0x5b)) {
      local_40 = local_40 | 0x20;
    }
    if (local_38 != local_40) break;
    c1 = c1 + 1;
    s2_local = s2_local + 1;
    if (local_38 == 0) {
      return 0;
    }
  }
  return local_38 - local_40;
}

Assistant:

ngx_int_t
ngx_strcasecmp(u_char *s1, u_char *s2)
{
    ngx_uint_t  c1, c2;

    for ( ;; ) {
        c1 = (ngx_uint_t) *s1++;
        c2 = (ngx_uint_t) *s2++;

        c1 = (c1 >= 'A' && c1 <= 'Z') ? (c1 | 0x20) : c1;
        c2 = (c2 >= 'A' && c2 <= 'Z') ? (c2 | 0x20) : c2;

        if (c1 == c2) {

            if (c1) {
                continue;
            }

            return 0;
        }

        return c1 - c2;
    }
}